

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlneuron.cxx
# Opt level: O1

void __thiscall MlNeuron::~MlNeuron(MlNeuron *this)

{
  string *this_00;
  
  this_00 = &this[-1].mlneuronRelaxation.super_StochasticVariable.super_StochasticProcess.
             stochDescription;
  ~MlNeuron((MlNeuron *)this_00);
  operator_delete(this_00,0x4a0);
  return;
}

Assistant:

void MlNeuron::prepareNextState()
{
	// create next value of differential equation
	mlneuronMembrane.prepareNextState();
	stochNextStateIsPrepared = mlneuronMembrane.isNextStatePrepared();
	stochNextValue = mlneuronMembrane.getNextValue();
	
	// proceed if calculation was successful
	if (stochNextStateIsPrepared) {
		if (stochNextValue > mlneuronTheta)
			eventNextValue = true;
		else 
			eventNextValue = false;
	}
}